

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat.cpp
# Opt level: O1

ScalarFunction * duckdb::ListConcatFun::GetFunction(void)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ScalarFunction *in_RDI;
  FunctionNullHandling in_stack_ffffffffffffff28;
  LogicalTypeId in_stack_ffffffffffffff30;
  PhysicalType in_stack_ffffffffffffff31;
  undefined6 in_stack_ffffffffffffff32;
  element_type *local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_c0;
  scalar_function_t local_b8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_98;
  LogicalType local_78;
  LogicalType local_60;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  LogicalType local_30;
  
  local_98.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffff30,ANY);
  LogicalType::LIST(&local_60,(LogicalType *)&stack0xffffffffffffff30);
  local_b8.super__Function_base._M_functor._8_8_ = 0;
  local_b8.super__Function_base._M_functor._M_unused._M_object = ConcatFunction;
  local_b8._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_b8.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_30,INVALID);
  ScalarFunction::ScalarFunction
            (in_RDI,(vector<duckdb::LogicalType,_true> *)&local_98,&local_60,&local_b8,
             BindConcatFunction,(bind_scalar_function_extended_t)0x0,ListConcatStats,
             (init_local_state_t)0x0,(LogicalType)ZEXT824(&local_30),CONSISTENT,
             in_stack_ffffffffffffff28,
             (bind_lambda_function_t)
             CONCAT62(in_stack_ffffffffffffff32,
                      CONCAT11(in_stack_ffffffffffffff31,in_stack_ffffffffffffff30)));
  LogicalType::~LogicalType(&local_30);
  if (local_b8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_b8.super__Function_base._M_manager)
              ((_Any_data *)&local_b8,(_Any_data *)&local_b8,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_60);
  LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffff30);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_98);
  LogicalType::LogicalType(&local_78,ANY);
  LogicalType::LIST((LogicalType *)&stack0xffffffffffffff30,&local_78);
  (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.id_ = in_stack_ffffffffffffff30;
  (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.physical_type_ =
       in_stack_ffffffffffffff31;
  uVar1 = *(undefined4 *)
           &(in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar2 = *(undefined4 *)
           ((long)&(in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.type_info_.
                   internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 4);
  uVar3 = *(undefined4 *)
           &(in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  uVar4 = *(undefined4 *)
           ((long)&(in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.type_info_.
                   internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount + 4);
  (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this = (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_c8;
  (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_c0._M_pi;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_48 = uVar1;
    uStack_44 = uVar2;
    uStack_40 = uVar3;
    uStack_3c = uVar4;
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffff30);
  LogicalType::~LogicalType(&local_78);
  (in_RDI->super_BaseScalarFunction).null_handling = SPECIAL_HANDLING;
  return in_RDI;
}

Assistant:

ScalarFunction ListConcatFun::GetFunction() {
	// The arguments and return types are set in the binder function.
	auto fun = ScalarFunction({}, LogicalType::LIST(LogicalType::ANY), ConcatFunction, BindConcatFunction, nullptr,
	                          ListConcatStats);
	fun.varargs = LogicalType::LIST(LogicalType::ANY);
	fun.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	return fun;
}